

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

EventLogEntry * __thiscall
TTD::TTEventList::GetNextAvailableEntry(TTEventList *this,size_t requiredSize)

{
  size_t sVar1;
  TTEventListLink *pTVar2;
  ulong uVar3;
  
  pTVar2 = this->m_headBlock;
  if (pTVar2 != (TTEventListLink *)0x0) {
    sVar1 = pTVar2->CurrPos;
    uVar3 = sVar1 + requiredSize;
    if (uVar3 < 0x10000) goto LAB_00805063;
  }
  AddArrayLink(this);
  pTVar2 = this->m_headBlock;
  sVar1 = pTVar2->CurrPos;
  uVar3 = requiredSize + sVar1;
LAB_00805063:
  pTVar2->CurrPos = uVar3;
  return (EventLogEntry *)(pTVar2->BlockData + sVar1);
}

Assistant:

NSLogEvents::EventLogEntry* TTEventList::GetNextAvailableEntry(size_t requiredSize)
    {
        if((this->m_headBlock == nullptr) || (this->m_headBlock->CurrPos + requiredSize >= TTD_EVENTLOG_LIST_BLOCK_SIZE))
        {
            this->AddArrayLink();
        }

        NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + this->m_headBlock->CurrPos);
        this->m_headBlock->CurrPos += requiredSize;

        return entry;
    }